

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O3

void __thiscall
Impl2T<poly::virtual_cloning_policy>::function(Impl2T<poly::virtual_cloning_policy> *this)

{
  long lVar1;
  elem_ptr_pointer pvVar2;
  ulong uVar3;
  elem_ptr_pointer pvVar4;
  Impl1 *this_00;
  Impl1 local_50;
  
  LOCK();
  UNLOCK();
  local_50.super_Interface.my_id =
       (size_t)Interface::last_id.super___atomic_base<unsigned_long>._M_i;
  local_50.super_Interface.throw_on_copy_construction = false;
  local_50.super_Interface._vptr_Interface = (_func_int **)&PTR_function_002b47a8;
  local_50.d = 3.1;
  Interface::last_id.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       (__atomic_base<unsigned_long>)
       (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  local_50.p._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)operator_new__(0x1bc)
  ;
  local_50.cookie.cookie = 0xdeadbeef;
  pvVar2 = (this->v)._free_elem;
  pvVar4 = (elem_ptr_pointer)(this->v)._begin_storage;
  if ((pvVar2 != pvVar4) && (uVar3 = (this->v)._align_max, 7 < uVar3)) {
    if (pvVar2 != (elem_ptr_pointer)
                  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage) {
      pvVar4 = (elem_ptr_pointer)((long)pvVar2[-1].ptr.first + pvVar2[-1].sf.first);
    }
    lVar1 = uVar3 - ((long)pvVar4 + (uVar3 - 1)) % uVar3;
    if ((void_pointer)((long)pvVar4 + lVar1 + 0x2f) <=
        (this->v).super_allocator_base<std::allocator<unsigned_char>_>._end_storage) {
      this_00 = (Impl1 *)(lVar1 + -1 + (long)pvVar4);
      Impl1::Impl1(this_00,&local_50);
      pvVar2 = (this->v)._free_elem;
      (pvVar2->ptr).first = this_00;
      (pvVar2->ptr).second = (Interface *)this_00;
      (pvVar2->sf).first = 0x30;
      (pvVar2->sf).second = 8;
      (this->v)._free_elem = pvVar2 + 1;
      goto LAB_001cc685;
    }
  }
  poly::vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
  push_back_new_elem_w_storage_increase<Impl1,Impl1>
            ((vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *)&this->v,
             &local_50);
LAB_001cc685:
  local_50.super_Interface._vptr_Interface = (_func_int **)&PTR_function_002b47a8;
  Cookie::~Cookie(&local_50.cookie);
  if ((_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
      local_50.p._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (int *)0x0) {
    operator_delete__((void *)local_50.p._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

explicit Interface(bool throw_on_copy = false)
        : my_id { last_id++ }
        , throw_on_copy_construction { throw_on_copy }
    {
    }